

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O1

void __thiscall VertexClustering::input(VertexClustering *this,string *filePath)

{
  map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_> *this_00;
  iterator *piVar1;
  VertexGroup *this_01;
  _Elt_pointer pVVar2;
  map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_> *pmVar3;
  int iVar4;
  int iVar5;
  int __tmp;
  char *pcVar6;
  VCFace *pVVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  long lVar10;
  _Base_ptr *__args;
  key_type *__k;
  pointer __args_00;
  int b;
  int c;
  int a;
  char _;
  double z;
  double y;
  vector<VCEdge,_std::allocator<VCEdge>_> edges;
  double x;
  vector<VCFace_*,_std::allocator<VCFace_*>_> faces;
  char s [256];
  int local_218;
  int local_214;
  int local_210;
  undefined1 local_209;
  VCFace *local_208;
  VCFace *local_200;
  vector<VCEdge,_std::allocator<VCEdge>_> local_1f8;
  key_type local_1d8;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  vector<VCFace_*,_std::allocator<VCFace_*>_> local_1b8;
  VertexClustering *local_198;
  FILE *local_190;
  Vertex local_188;
  char local_138 [264];
  
  local_190 = fopen((filePath->_M_dataplus)._M_p,"r");
  local_1f8.super__Vector_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (VCEdge *)0x0;
  local_1f8.super__Vector_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.super__Vector_impl_data.
  _M_start = (VCEdge *)0x0;
  local_1f8.super__Vector_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.super__Vector_impl_data.
  _M_finish = (VCEdge *)0x0;
  local_1b8.super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (VCFace **)0x0;
  local_1b8.super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1b8.super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (VCFace **)0x0;
  pcVar6 = fgets(local_138,0x100,local_190);
  if (pcVar6 != (char *)0x0) {
    this_00 = &this->edgeMap;
    pmVar3 = &this->edgeMap;
    local_198 = this;
    do {
      if (local_138[0] == 'f') {
        this->cntFace = this->cntFace + 1;
        __isoc99_sscanf(local_138,"%c%d%d%d",&local_209,&local_210,&local_218,&local_214);
        iVar5 = local_210;
        iVar4 = local_218;
        if (local_214 < local_218) {
          local_218 = local_214;
          local_214 = iVar4;
        }
        if (local_218 < local_210) {
          local_210 = local_218;
          local_218 = iVar5;
        }
        iVar4 = local_218;
        if (local_214 < local_218) {
          local_218 = local_214;
          local_214 = iVar4;
        }
        Vertex::addNeighborVertex
                  ((Vertex *)(&this->vGroup->field_0x0 + (long)local_210 * 0x50),local_218);
        Vertex::addNeighborVertex
                  ((Vertex *)(&this->vGroup->field_0x0 + (long)local_210 * 0x50),local_214);
        Vertex::addNeighborVertex
                  ((Vertex *)(&this->vGroup->field_0x0 + (long)local_218 * 0x50),local_210);
        Vertex::addNeighborVertex
                  ((Vertex *)(&this->vGroup->field_0x0 + (long)local_218 * 0x50),local_214);
        Vertex::addNeighborVertex
                  ((Vertex *)(&this->vGroup->field_0x0 + (long)local_214 * 0x50),local_210);
        Vertex::addNeighborVertex
                  ((Vertex *)(&this->vGroup->field_0x0 + (long)local_214 * 0x50),local_218);
        pVVar7 = (VCFace *)operator_new(0x150);
        VCFace::VCFace(pVVar7,local_210,local_218,local_214,this->vGroup,
                       *(this->clusters).
                        super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>._M_impl.
                        super__Vector_impl_data._M_start);
        local_208 = pVVar7;
        if (local_1b8.super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1b8.super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<VCFace*,std::allocator<VCFace*>>::_M_realloc_insert<VCFace*const&>
                    ((vector<VCFace*,std::allocator<VCFace*>> *)&local_1b8,
                     (iterator)
                     local_1b8.super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_208);
        }
        else {
          *local_1b8.super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>._M_impl.
           super__Vector_impl_data._M_finish = pVVar7;
          local_1b8.super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1b8.super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_1d8.a = local_210;
        local_1d8.b = local_218;
        local_1d0 = local_210;
        local_1cc = local_214;
        local_1c8 = local_218;
        local_1c4 = local_214;
        lVar10 = 0;
        do {
          __k = (key_type *)((long)&local_1d8.a + lVar10);
          iVar8 = std::
                  _Rb_tree<VCPair,_std::pair<const_VCPair,_VCEdge>,_std::_Select1st<std::pair<const_VCPair,_VCEdge>_>,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>
                  ::find(&this_00->_M_t,__k);
          pVVar7 = local_208;
          if ((_Rb_tree_header *)iVar8._M_node == &(pmVar3->_M_t)._M_impl.super__Rb_tree_header) {
            pmVar9 = std::
                     map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>
                     ::operator[](this_00,__k);
            pmVar9->f1 = pVVar7;
            pmVar9->f2 = (VCFace *)0x0;
          }
          else {
            iVar8._M_node[1]._M_left = (_Base_ptr)local_208;
            local_200 = local_208;
            std::
            _Rb_tree<VCFace*,VCFace*,std::_Identity<VCFace*>,std::less<VCFace*>,std::allocator<VCFace*>>
            ::_M_insert_unique<VCFace*const&>
                      ((_Rb_tree<VCFace*,VCFace*,std::_Identity<VCFace*>,std::less<VCFace*>,std::allocator<VCFace*>>
                        *)&iVar8._M_node[1]._M_parent[7]._M_left,&local_200);
            __args = &iVar8._M_node[1]._M_parent;
            local_200 = (VCFace *)*__args;
            std::
            _Rb_tree<VCFace*,VCFace*,std::_Identity<VCFace*>,std::less<VCFace*>,std::allocator<VCFace*>>
            ::_M_insert_unique<VCFace*const&>
                      ((_Rb_tree<VCFace*,VCFace*,std::_Identity<VCFace*>,std::less<VCFace*>,std::allocator<VCFace*>>
                        *)&local_208->neighbor,&local_200);
            if (local_1f8.super__Vector_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_1f8.super__Vector_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<VCEdge,std::allocator<VCEdge>>::_M_realloc_insert<VCEdge_const&>
                        ((vector<VCEdge,std::allocator<VCEdge>> *)&local_1f8,
                         (iterator)
                         local_1f8.super__Vector_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
                         super__Vector_impl_data._M_finish,(VCEdge *)__args);
            }
            else {
              pVVar7 = (VCFace *)iVar8._M_node[1]._M_left;
              (local_1f8.super__Vector_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
               super__Vector_impl_data._M_finish)->f1 = (VCFace *)*__args;
              (local_1f8.super__Vector_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
               super__Vector_impl_data._M_finish)->f2 = pVVar7;
              local_1f8.super__Vector_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1f8.super__Vector_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          lVar10 = lVar10 + 8;
          this = local_198;
        } while (lVar10 != 0x18);
      }
      else if (local_138[0] == 'v') {
        __isoc99_sscanf(local_138,"%c%lf%lf%lf",&local_209,&local_1d8,&local_200,&local_208);
        if (((NAN((double)CONCAT44(local_1d8.b,local_1d8.a))) || (NAN((double)local_200))) ||
           (NAN((double)local_208))) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"warning: nan vertex in input",0x1c);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
          std::ostream::put(-0x28);
          std::ostream::flush();
        }
        this_01 = this->vGroup;
        Vertex::Vertex(&local_188,(double)CONCAT44(local_1d8.b,local_1d8.a),(double)local_200,
                       (double)local_208);
        VertexGroup::addVertex(this_01,&local_188);
        Vertex::~Vertex(&local_188);
      }
      pcVar6 = fgets(local_138,0x100,local_190);
    } while (pcVar6 != (char *)0x0);
  }
  if ((this->opts).adaptive == true) {
    calcCurvature(this,&local_1b8);
  }
  initClusters(this,&local_1f8);
  if (local_1f8.super__Vector_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_1f8.super__Vector_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    __args_00 = local_1f8.super__Vector_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
                super__Vector_impl_data._M_start;
    do {
      if (((__args_00->f2 != (VCFace *)0x0) && (__args_00->f1 != (VCFace *)0x0)) &&
         (__args_00->f1->cluster != __args_00->f2->cluster)) {
        pVVar2 = (this->boundary).c.super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
        if (pVVar2 == (this->boundary).c.super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<VCEdge,std::allocator<VCEdge>>::_M_push_back_aux<VCEdge_const&>
                    ((deque<VCEdge,std::allocator<VCEdge>> *)&this->boundary,__args_00);
        }
        else {
          pVVar7 = __args_00->f2;
          pVVar2->f1 = __args_00->f1;
          pVVar2->f2 = pVVar7;
          piVar1 = &(this->boundary).c.super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
                    super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
      }
      __args_00 = __args_00 + 1;
    } while (__args_00 !=
             local_1f8.super__Vector_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_1b8.super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1f8.super__Vector_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.super__Vector_impl_data.
      _M_start != (VCEdge *)0x0) {
    operator_delete(local_1f8.super__Vector_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void VertexClustering::input(const string& filePath)
{
	FILE* f = fopen(filePath.c_str(), "r");
	int cntv = 0, cntf = 0;
	char s[256], _;
	vector<VCEdge> edges;
	vector<VCFace *> faces;

	while (fgets(s, sizeof s, f) != NULL) {
		switch (s[0]) {
		case '#': break; 
		case 'v': {
			cntv++;
			double x, y, z;
			sscanf(s, "%c%lf%lf%lf", &_, &x, &y, &z);
			if (x != x || y != y || z != z) {
				cout << "warning: nan vertex in input" << endl;
			}
			vGroup->addVertex(Vertex(x, y, z));
			break;
		}
		case 'f': {
			cntf++;
			cntFace++;
			int a, b, c;
			sscanf(s, "%c%d%d%d",&_, &a, &b, &c);
			VCSort3(a, b, c);
			vGroup->group[a].addNeighborVertex(b);
			vGroup->group[a].addNeighborVertex(c);
			vGroup->group[b].addNeighborVertex(a);
			vGroup->group[b].addNeighborVertex(c);
			vGroup->group[c].addNeighborVertex(a);
			vGroup->group[c].addNeighborVertex(b);
			VCFace* f = new VCFace(a, b, c, vGroup, clusters[0]); //face pointers tracked by clusters
			faces.push_back(f);
			VCPair pairs[3] = { VCPair(a,b), VCPair(a,c), VCPair(b,c) };
			for (int i = 0; i < 3; ++i) {
				auto iter = edgeMap.find(pairs[i]);
				if (iter != edgeMap.end()) {
					iter->second.f2 = f;
					iter->second.f1->addNeighbor(f);
					f->addNeighbor(iter->second.f1);
					edges.push_back(iter->second);
				}
				else {
					edgeMap[pairs[i]] = VCEdge(f, NULL);
				}
			}
			break;
		}
		default: break;
		}
	}
	if(opts.adaptive)
		calcCurvature(faces); //only uniform remeshing can skip this step
	initClusters(edges);
	for (auto e = edges.begin(); e != edges.end(); ++e) {
		if (e->isBoundary())
			boundary.push(*e);
	}
}